

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

void __thiscall
flatbuffers::java::JavaGenerator::GenUnionUnPack_ObjectAPI
          (JavaGenerator *this,EnumDef *enum_def,string *code,string *type_name,string *field_name,
          bool is_vector)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  pointer pcVar4;
  EnumVal *v;
  long *plVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  ulong *puVar10;
  char *pcVar11;
  undefined8 uVar12;
  undefined3 in_register_00000089;
  pointer ppEVar13;
  char *pcVar14;
  string actual_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string indent;
  string variable_name;
  string type_params;
  string value_params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string variable_type;
  string local_248;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  long lStack_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string *local_188;
  string local_180;
  string local_160;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  string local_c0;
  long *local_a0 [2];
  long local_90 [2];
  string *local_80;
  EnumDef *local_78;
  JavaGenerator *local_70;
  int local_64;
  Namer *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_188 = code;
  local_80 = field_name;
  local_78 = enum_def;
  local_70 = this;
  if (CONCAT31(in_register_00000089,is_vector) == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar4 = (type_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar4,pcVar4 + type_name->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)type_name);
  }
  paVar2 = &local_180.field_2;
  local_180._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"o","");
  local_60 = &(local_70->namer_).super_Namer;
  Namer::Variable(&local_c0,local_60,&local_180,local_80);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x36b24c);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_d0 = *plVar8;
    lStack_c8 = plVar5[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar8;
    local_e0 = (long *)*plVar5;
  }
  local_d8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar14 = "";
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_120.field_2._M_allocated_capacity = *psVar9;
    local_120.field_2._8_8_ = plVar5[3];
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar9;
    local_120._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_120._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  pcVar11 = "_j";
  if (!is_vector) {
    pcVar11 = "";
  }
  uVar6 = (ulong)is_vector;
  local_e0 = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar11,pcVar11 + uVar6 * 2);
  if (is_vector) {
    pcVar14 = ", _j";
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,pcVar14,pcVar14 + uVar6 * 4);
  pcVar14 = "    ";
  if (is_vector) {
    pcVar14 = "      ";
  }
  local_180._M_dataplus._M_p = (pointer)paVar2;
  local_64 = CONCAT31(in_register_00000089,is_vector);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,pcVar14,pcVar14 + uVar6 * 2 + 4);
  std::operator+(&local_1a8,&local_180,&local_58);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  paVar2 = &local_1c8.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1c8.field_2._M_allocated_capacity = *psVar9;
    local_1c8.field_2._8_8_ = plVar5[3];
    local_1c8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar9;
    local_1c8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1c8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1c8,(ulong)local_120._M_dataplus._M_p);
  paVar1 = &local_1e8.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1e8.field_2._M_allocated_capacity = *psVar9;
    local_1e8.field_2._8_8_ = plVar5[3];
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar9;
    local_1e8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1e8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_1f8 = *puVar10;
    lStack_1f0 = plVar5[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar10;
    local_208 = (ulong *)*plVar5;
  }
  local_200 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_58._M_dataplus._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_218 = *plVar8;
    lStack_210 = plVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar8;
    local_228 = (long *)*plVar5;
  }
  local_220 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248.field_2._8_8_ = plVar5[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_248._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  BVar3 = (local_78->underlying_type).base_type;
  uVar6 = 7;
  if ((((ulong)BVar3 != 4) && (BVar3 != BASE_TYPE_USHORT)) &&
     (uVar6 = (ulong)BVar3, BVar3 == BASE_TYPE_UINT)) {
    uVar6 = 9;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,
             *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::java_typename + uVar6 * 8
                       ),(allocator<char> *)local_a0);
  plVar5 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_100,0,(char *)0x0,(ulong)local_180._M_dataplus._M_p);
  local_140 = &local_130;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_130 = *plVar8;
    lStack_128 = plVar5[3];
  }
  else {
    local_130 = *plVar8;
    local_140 = (long *)*plVar5;
  }
  local_138 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_160.field_2._M_allocated_capacity = *psVar9;
    local_160.field_2._8_8_ = plVar5[3];
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar9;
    local_160._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_160,(ulong)local_120._M_dataplus._M_p);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_1a8.field_2._M_allocated_capacity = *puVar10;
    local_1a8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1a8.field_2._M_allocated_capacity = *puVar10;
    local_1a8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1a8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_1c8.field_2._M_allocated_capacity = *puVar10;
    local_1c8.field_2._8_8_ = plVar5[3];
    local_1c8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *puVar10;
    local_1c8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1c8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)(local_80->_M_dataplus)._M_p);
  puVar10 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_1e8.field_2._M_allocated_capacity = *puVar10;
    local_1e8.field_2._8_8_ = puVar7[3];
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *puVar10;
    local_1e8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_1e8._M_string_length = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_1f8 = *puVar10;
    lStack_1f0 = plVar5[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar10;
    local_208 = (ulong *)*plVar5;
  }
  local_200 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_e0);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_218 = *plVar8;
    lStack_210 = plVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar8;
    local_228 = (long *)*plVar5;
  }
  local_220 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248.field_2._8_8_ = plVar5[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_248._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  std::operator+(&local_1e8,&local_180,&local_120);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_1f8 = *puVar10;
    lStack_1f0 = plVar5[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar10;
    local_208 = (ulong *)*plVar5;
  }
  local_200 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_120._M_dataplus._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_218 = *plVar8;
    lStack_210 = plVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar8;
    local_228 = (long *)*plVar5;
  }
  local_220 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248.field_2._8_8_ = plVar5[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_248._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_208);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_120._M_dataplus._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_218 = *plVar8;
    lStack_210 = plVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar8;
    local_228 = (long *)*plVar5;
  }
  local_220 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248.field_2._8_8_ = plVar5[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_248._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_208);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_120._M_dataplus._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_218 = *plVar8;
    lStack_210 = plVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar8;
    local_228 = (long *)*plVar5;
  }
  local_220 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248.field_2._8_8_ = plVar5[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_248._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  ppEVar13 = (local_78->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar13 !=
      (local_78->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_38 = &local_70->package_prefix_;
    do {
      v = *ppEVar13;
      BVar3 = (v->union_type).base_type;
      if (((BVar3 != BASE_TYPE_NONE) && (BVar3 != BASE_TYPE_STRING)) &&
         ((BVar3 != BASE_TYPE_STRUCT || (((v->union_type).struct_def)->fixed == false)))) {
        local_208 = &local_1f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
        std::__cxx11::string::append((char *)&local_208);
        IdlNamer::NamespacedEnumVariant_abi_cxx11_(&local_1c8,(IdlNamer *)local_60,local_78,v);
        std::operator+(&local_1e8,local_38,&local_1c8);
        uVar6 = 0xf;
        if (local_208 != &local_1f8) {
          uVar6 = local_1f8;
        }
        if (uVar6 < local_1e8._M_string_length + local_200) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            uVar12 = local_1e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_1e8._M_string_length + local_200) goto LAB_0023c97b;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_208);
        }
        else {
LAB_0023c97b:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_1e8._M_dataplus._M_p);
        }
        local_228 = &local_218;
        plVar5 = puVar7 + 2;
        if ((long *)*puVar7 == plVar5) {
          local_218 = *plVar5;
          lStack_210 = puVar7[3];
        }
        else {
          local_218 = *plVar5;
          local_228 = (long *)*puVar7;
        }
        local_220 = puVar7[1];
        *puVar7 = plVar5;
        puVar7[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_248.field_2._M_allocated_capacity = *psVar9;
          local_248.field_2._8_8_ = plVar5[3];
        }
        else {
          local_248.field_2._M_allocated_capacity = *psVar9;
          local_248._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_248._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        GenTypeGet_abi_cxx11_(&local_248,local_70,&v->union_type);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
        std::__cxx11::string::append((char *)local_a0);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_a0,(ulong)local_120._M_dataplus._M_p);
        local_100 = &local_f0;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_f0 = *plVar8;
          lStack_e8 = plVar5[3];
        }
        else {
          local_f0 = *plVar8;
          local_100 = (long *)*plVar5;
        }
        local_f8 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_140 = &local_130;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_130 = *plVar8;
          lStack_128 = plVar5[3];
        }
        else {
          local_130 = *plVar8;
          local_140 = (long *)*plVar5;
        }
        local_138 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_140,(ulong)(local_80->_M_dataplus)._M_p);
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_160.field_2._M_allocated_capacity = *psVar9;
          local_160.field_2._8_8_ = plVar5[3];
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar9;
          local_160._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_160._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1a8.field_2._M_allocated_capacity = *psVar9;
          local_1a8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar9;
          local_1a8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1a8,(ulong)local_248._M_dataplus._M_p);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1c8.field_2._M_allocated_capacity = *psVar9;
          local_1c8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1c8.field_2._M_allocated_capacity = *psVar9;
          local_1c8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1c8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1e8.field_2._M_allocated_capacity = *psVar9;
          local_1e8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1e8.field_2._M_allocated_capacity = *psVar9;
          local_1e8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1e8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1e8,(ulong)local_c0._M_dataplus._M_p);
        local_208 = &local_1f8;
        puVar10 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar10) {
          local_1f8 = *puVar10;
          lStack_1f0 = plVar5[3];
        }
        else {
          local_1f8 = *puVar10;
          local_208 = (ulong *)*plVar5;
        }
        local_200 = plVar5[1];
        *plVar5 = (long)puVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
        local_228 = &local_218;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_218 = *plVar8;
          lStack_210 = plVar5[3];
        }
        else {
          local_218 = *plVar8;
          local_228 = (long *)*plVar5;
        }
        local_220 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228);
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
        std::__cxx11::string::append((char *)local_a0);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_a0,(ulong)local_120._M_dataplus._M_p);
        local_100 = &local_f0;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_f0 = *plVar8;
          lStack_e8 = plVar5[3];
        }
        else {
          local_f0 = *plVar8;
          local_100 = (long *)*plVar5;
        }
        local_f8 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_140 = &local_130;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_130 = *plVar8;
          lStack_128 = plVar5[3];
        }
        else {
          local_130 = *plVar8;
          local_140 = (long *)*plVar5;
        }
        local_138 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_140,(ulong)local_120._M_dataplus._M_p);
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_160.field_2._M_allocated_capacity = *psVar9;
          local_160.field_2._8_8_ = plVar5[3];
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar9;
          local_160._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_160._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        puVar10 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_1a8.field_2._M_allocated_capacity = *puVar10;
          local_1a8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar10;
          local_1a8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a8._M_string_length = plVar5[1];
        *plVar5 = (long)puVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1a8,(ulong)local_248._M_dataplus._M_p);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        puVar10 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_1c8.field_2._M_allocated_capacity = *puVar10;
          local_1c8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1c8.field_2._M_allocated_capacity = *puVar10;
          local_1c8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1c8._M_string_length = plVar5[1];
        *plVar5 = (long)puVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        puVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_1e8.field_2._M_allocated_capacity = *puVar10;
          local_1e8.field_2._8_8_ = puVar7[3];
        }
        else {
          local_1e8.field_2._M_allocated_capacity = *puVar10;
          local_1e8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_1e8._M_string_length = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1e8,(ulong)local_120._M_dataplus._M_p);
        local_208 = &local_1f8;
        puVar10 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar10) {
          local_1f8 = *puVar10;
          lStack_1f0 = plVar5[3];
        }
        else {
          local_1f8 = *puVar10;
          local_208 = (ulong *)*plVar5;
        }
        local_200 = plVar5[1];
        *plVar5 = (long)puVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
        local_228 = &local_218;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_218 = *plVar8;
          lStack_210 = plVar5[3];
        }
        else {
          local_218 = *plVar8;
          local_228 = (long *)*plVar5;
        }
        local_220 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228);
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        local_228 = &local_218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
        std::__cxx11::string::append((char *)&local_228);
        std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228);
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
      }
      ppEVar13 = ppEVar13 + 1;
    } while (ppEVar13 !=
             (local_78->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  paVar2 = &local_1c8.field_2;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_64 == '\0') goto LAB_0023d913;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_1c8);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"o","");
  Namer::Variable(&local_1a8,local_60,&local_160,local_80);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    uVar12 = local_1c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_1a8._M_string_length + local_1c8._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      uVar12 = local_1a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_1a8._M_string_length + local_1c8._M_string_length) goto LAB_0023d6b7;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1c8._M_dataplus._M_p);
  }
  else {
LAB_0023d6b7:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1a8._M_dataplus._M_p);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  puVar10 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_1e8.field_2._M_allocated_capacity = *puVar10;
    local_1e8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *puVar10;
    local_1e8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_1e8._M_string_length = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)puVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_208 = &local_1f8;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_1f8 = *puVar10;
    lStack_1f0 = plVar5[3];
  }
  else {
    local_1f8 = *puVar10;
    local_208 = (ulong *)*plVar5;
  }
  local_200 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_120._M_dataplus._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_218 = *plVar8;
    lStack_210 = plVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar8;
    local_228 = (long *)*plVar5;
  }
  local_220 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248.field_2._8_8_ = plVar5[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_248._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
LAB_0023d913:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenUnionUnPack_ObjectAPI(const EnumDef &enum_def, std::string &code,
                                const std::string &type_name,
                                const std::string &field_name,
                                bool is_vector) const {
    const std::string variable_type =
        is_vector ? type_name.substr(0, type_name.length() - 2) : type_name;
    const std::string variable_name =
        "_" + namer_.Variable("o", field_name) + (is_vector ? "Element" : "");
    const std::string type_params = is_vector ? "_j" : "";
    const std::string value_params = is_vector ? ", _j" : "";
    const std::string indent = (is_vector ? "      " : "    ");

    code += indent + variable_type + " " + variable_name + " = new " +
            variable_type + "();\n";
    code += indent +
            GenTypeBasic(DestinationType(enum_def.underlying_type, false)) +
            " " + variable_name + "Type = " + field_name + "Type(" +
            type_params + ");\n";
    code += indent + variable_name + ".setType(" + variable_name + "Type);\n";
    code += indent + "Table " + variable_name + "Value;\n";
    code += indent + "switch (" + variable_name + "Type) {\n";
    for (auto eit = enum_def.Vals().begin(); eit != enum_def.Vals().end();
         ++eit) {
      auto &ev = **eit;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        continue;
      } else {
        if (ev.union_type.base_type == BASE_TYPE_STRING ||
            (ev.union_type.base_type == BASE_TYPE_STRUCT &&
             ev.union_type.struct_def->fixed)) {
          continue;  // This branch is due to bad implemantation of Unions in
                     // Java which doesn't handle non Table types. Should be
                     // deleted when issue #6561 is fixed.
        }
        code += indent + "  case " +
                Prefixed(namer_.NamespacedEnumVariant(enum_def, ev)) + ":\n";
        auto actual_type = GenTypeGet(ev.union_type);
        code += indent + "    " + variable_name + "Value = " + field_name +
                "(new " + actual_type + "()" + value_params + ");\n";
        code += indent + "    " + variable_name + ".setValue(" + variable_name +
                "Value != null ? ((" + actual_type + ") " + variable_name +
                "Value).unpack() : null);\n";
        code += indent + "    break;\n";
      }
    }
    code += indent + "  default: break;\n";
    code += indent + "}\n";
    if (is_vector) {
      code += indent + "_" + namer_.Variable("o", field_name) +
              "[_j] = " + variable_name + ";\n";
    }
  }